

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O1

void __thiscall
TPZGradientReconstruction::TPZGradientData::Print(TPZGradientData *this,ostream *out)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  char string [256];
  char local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  lVar3 = 0;
  sprintf(local_138,"\t%s","Cell average");
  sVar1 = strlen(local_138);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
  sprintf(local_138,"\t%s","Center Point");
  sVar1 = strlen(local_138);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
  sprintf(local_138,"\t\t%s","Gradient");
  sVar1 = strlen(local_138);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
  sprintf(local_138,"\t\t%s","Slope limiter");
  sVar1 = strlen(local_138);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  builtin_strncpy(local_138,"Cel",4);
  sVar1 = strlen(local_138);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  std::ostream::_M_insert<double>
            (*(this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.super_TPZVec<double>.
              fStore);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t(",2);
  do {
    sprintf(local_138,"%f",
            (((this->fCenterPointCellAndNeighbors).super_TPZManVector<TPZManVector<double,_3>,_10>.
              super_TPZVec<TPZManVector<double,_3>_>.fStore)->super_TPZVec<double>).fStore[lVar3]);
    sVar1 = strlen(local_138);
    std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
    if (lVar3 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t(",2);
  lVar3 = 0;
  do {
    std::ostream::_M_insert<double>((this->fGradient).super_TPZVec<double>.fStore[lVar3]);
    if (lVar3 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  poVar2 = std::ostream::_M_insert<double>(this->fSlopeLimiter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (1 < (this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.super_TPZVec<double>.
          fNElements) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Neigh",5);
      std::ostream::operator<<(out,(int)lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
      std::ostream::_M_insert<double>
                ((this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.super_TPZVec<double>.
                 fStore[lVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(out,"\t(",2);
      lVar4 = 0;
      do {
        std::ostream::_M_insert<double>
                  ((this->fCenterPointCellAndNeighbors).
                   super_TPZManVector<TPZManVector<double,_3>,_10>.
                   super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar3].super_TPZVec<double>.fStore
                   [lVar4]);
        if (lVar4 != 2) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      std::__ostream_insert<char,std::char_traits<char>>(out,")\n",2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.
                     super_TPZVec<double>.fNElements);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Center Point Interface",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  if (0 < (this->fCenterPointInterface).super_TPZManVector<TPZManVector<double,_3>,_10>.
          super_TPZVec<TPZManVector<double,_3>_>.fNElements) {
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
      lVar4 = 0;
      do {
        sprintf(local_138,"%f",
                (this->fCenterPointInterface).super_TPZManVector<TPZManVector<double,_3>,_10>.
                super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar3].super_TPZVec<double>.fStore
                [lVar4]);
        sVar1 = strlen(local_138);
        std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar1);
        if (lVar4 != 2) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      std::__ostream_insert<char,std::char_traits<char>>(out,")\n",2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->fCenterPointInterface).super_TPZManVector<TPZManVector<double,_3>,_10>.
                     super_TPZVec<TPZManVector<double,_3>_>.fNElements);
  }
  return;
}

Assistant:

void TPZGradientReconstruction::TPZGradientData::Print(std::ostream &out) const
{
    const char *name1 = "Cell average";
    const char *name2 = "Center Point";
    const char *name3 = "Gradient";
    const char *name4 = "Slope limiter";
    
    const char *name5 = "Cel";
    const char *name6 = "Neigh";
    const char *name7 = "Center Point Interface";
    
    char string[256];
    
    out<<"\n\n";
    sprintf(string, "\t%s", name1);
    out << string ;
    sprintf(string, "\t%s", name2);
    out << string ;
    sprintf(string, "\t\t%s", name3);
    out << string ;
    sprintf(string, "\t\t%s", name4);
    out << string ;
    out<<"\n";
    
    sprintf(string, "%s", name5);
    out << string ;
    
    out << "\t" ;
    out << fSolCellAndNeighbors[0];
    
    int i, j;
    out<<"\t(";
    for(j=0; j<3; j++ ){
        sprintf(string, "%f", fCenterPointCellAndNeighbors[0][j]);
        out << string;
        if (j<2) out<<",";
    }
    out <<")";
    
    out<<"\t(";
    for(i=0; i<3; i++ ){
        out << fGradient[i];
        if (i<2) out<<",";
    }
    out <<")";
    
    out << "\t" << fSlopeLimiter << "\n";
    
    
    for (i=1; i<fSolCellAndNeighbors.size(); i++)
    {
        out << name6 <<i;
        
        out << "\t" << fSolCellAndNeighbors[i];
        
        out<<"\t(";
        for(j=0; j<3; j++ ){
            out << fCenterPointCellAndNeighbors[i][j];
            if (j<2) out<<",";
        }
        out <<")\n";
    }
    //Interface
    out <<"\n\n" << name7 <<"\n";
    for (i=0; i<fCenterPointInterface.size(); i++)
    {
        out<<"(";
        for(j=0; j<3; j++ ){
            sprintf(string, "%f", fCenterPointInterface[i][j]);
            out << string;
            if (j<2) out<<",";
        }
        out <<")\n";
    }
    
}